

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.h
# Opt level: O2

void __thiscall
shared_data::update_dump_interval(shared_data *this,bool progress_add,float progress_arg)

{
  undefined3 in_register_00000031;
  float fVar1;
  
  this->sum_loss_since_last_dump = 0.0;
  this->old_weighted_labeled_examples = this->weighted_labeled_examples;
  fVar1 = (float)(this->weighted_labeled_examples + this->weighted_unlabeled_examples);
  if (CONCAT31(in_register_00000031,progress_add) == 0) {
    fVar1 = fVar1 * progress_arg;
  }
  else {
    fVar1 = fVar1 + progress_arg;
  }
  this->dump_interval = fVar1;
  return;
}

Assistant:

inline void update_dump_interval(bool progress_add, float progress_arg)
  {
    sum_loss_since_last_dump = 0.0;
    old_weighted_labeled_examples = weighted_labeled_examples;
    if (progress_add)
      dump_interval = (float)weighted_examples() + progress_arg;
    else
      dump_interval = (float)weighted_examples() * progress_arg;
  }